

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O0

void lowbd_blend_a64_d16_mask_subw0_subh1_w32_avx2
               (uint8_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int h,
               int w,__m256i *round_offset,int shift)

{
  undefined1 auVar1 [16];
  uint in_ECX;
  long in_RDX;
  void *in_RSI;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [64];
  long in_stack_00000008;
  __m256i m0;
  __m256i m_ac;
  __m256i m_i10;
  __m256i m_i00;
  int j;
  int i;
  __m256i zeros;
  __m256i v_maxval;
  undefined4 in_stack_fffffffffffffd2c;
  int in_stack_fffffffffffffd30;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined4 local_208;
  undefined4 local_204;
  undefined8 uStack_1f8;
  undefined8 local_198;
  
  auVar1 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar1 = vpinsrw_avx(auVar1,0x40,2);
  auVar1 = vpinsrw_avx(auVar1,0x40,3);
  auVar1 = vpinsrw_avx(auVar1,0x40,4);
  auVar1 = vpinsrw_avx(auVar1,0x40,5);
  auVar1 = vpinsrw_avx(auVar1,0x40,6);
  vpinsrw_avx(auVar1,0x40,7);
  auVar1 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar1 = vpinsrw_avx(auVar1,0x40,2);
  auVar1 = vpinsrw_avx(auVar1,0x40,3);
  auVar1 = vpinsrw_avx(auVar1,0x40,4);
  auVar1 = vpinsrw_avx(auVar1,0x40,5);
  auVar1 = vpinsrw_avx(auVar1,0x40,6);
  vpinsrw_avx(auVar1,0x40,7);
  auVar4 = ZEXT3264(ZEXT832(0) << 0x20);
  local_198 = in_RDX;
  for (local_204 = 0; local_204 < (int)mask_stride; local_204 = local_204 + 1) {
    for (local_208 = 0; auVar2 = auVar4._0_32_, local_208 < h; local_208 = local_208 + 0x20) {
      yy_loadu_256((__m256i *)(in_stack_00000008 + local_208),in_RSI);
      auVar3 = auVar2;
      yy_loadu_256((__m256i *)(in_stack_00000008 + ((ulong)mask & 0xffffffff) + (long)local_208),
                   in_RSI);
      auVar2 = vpaddusb_avx2(auVar2,auVar3);
      uStack_1f8 = SUB328(ZEXT832(0),4);
      auVar2 = vpavgb_avx2(auVar2,ZEXT832(uStack_1f8) << 0x40);
      local_280 = auVar2._0_8_;
      uStack_278 = auVar2._8_8_;
      uStack_270 = auVar2._16_8_;
      uStack_268 = auVar2._24_8_;
      vpmovzxbw_avx2(auVar2._0_16_);
      auVar2 = vpmovzxbw_avx2(auVar2._16_16_);
      in_RSI = (void *)(local_198 + (long)local_208 * 2);
      auVar4 = ZEXT1664(auVar2._0_16_);
      blend_a64_d16_mask_w32_avx2
                (uStack_270,uStack_278,local_280,(__m256i *)uStack_278,(__m256i *)local_280,
                 uStack_268,(__m256i *)CONCAT44(in_stack_fffffffffffffd2c,round_offset._0_4_),
                 in_stack_fffffffffffffd30);
    }
    in_stack_00000008 = in_stack_00000008 + (ulong)(uint)((int)mask << 1);
    local_198 = local_198 + (ulong)in_ECX * 2;
  }
  return;
}

Assistant:

static inline void lowbd_blend_a64_d16_mask_subw0_subh1_w32_avx2(
    uint8_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int h, int w,
    const __m256i *round_offset, int shift) {
  const __m256i v_maxval = _mm256_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);
  const __m256i zeros = _mm256_setzero_si256();
  for (int i = 0; i < h; ++i) {
    for (int j = 0; j < w; j += 32) {
      const __m256i m_i00 = yy_loadu_256(mask + j);
      const __m256i m_i10 = yy_loadu_256(mask + mask_stride + j);

      const __m256i m_ac =
          _mm256_avg_epu8(_mm256_adds_epu8(m_i00, m_i10), zeros);
      const __m256i m0 = _mm256_cvtepu8_epi16(_mm256_castsi256_si128(m_ac));
      const __m256i m1 =
          _mm256_cvtepu8_epi16(_mm256_extracti128_si256(m_ac, 1));

      blend_a64_d16_mask_w32_avx2(dst + j, src0 + j, src1 + j, &m0, &m1,
                                  round_offset, &v_maxval, shift);
    }
    mask += mask_stride << 1;
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
  }
}